

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddBtreeIndex(WhereLoopBuilder *pBuilder,SrcItem *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  ushort uVar2;
  u16 uVar3;
  u16 uVar4;
  ushort uVar5;
  ushort uVar6;
  LogEst LVar7;
  uint uVar8;
  Parse *pParse;
  sqlite3 *db;
  WhereLoop *p;
  ulong uVar9;
  Expr *pEVar10;
  ushort uVar11;
  LogEst LVar12;
  ushort uVar13;
  short a;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  WhereTerm *pTerm;
  short sVar18;
  ushort uVar19;
  short sVar20;
  ulong uVar21;
  u64 x;
  short sVar22;
  u32 uVar23;
  byte bVar24;
  WhereScan scan;
  uint local_120;
  WhereTerm *local_110;
  uint local_108;
  WhereTerm *local_f8;
  WhereScan local_a0;
  
  pParse = pBuilder->pWInfo->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return 7;
  }
  p = pBuilder->pNew;
  uVar8 = p->wsFlags;
  uVar16 = 0x18;
  if ((uVar8 & 0x20) == 0) {
    uVar16 = 0x1bf;
  }
  uVar23 = uVar16 & 0xffffff83;
  if ((*(ushort *)&pProbe->field_0x63 & 4) == 0) {
    uVar23 = uVar16;
  }
  uVar2 = (p->u).btree.nEq;
  uVar3 = (p->u).btree.nBtm;
  uVar4 = (p->u).btree.nTop;
  uVar5 = p->nSkip;
  uVar6 = p->nLTerm;
  uVar9 = p->prereq;
  LVar7 = p->nOut;
  pTerm = whereScanInit(&local_a0,pBuilder->pWC,pSrc->iCursor,(uint)uVar2,uVar23,pProbe);
  p->rSetup = 0;
  sVar18 = *pProbe->aiRowLogEst;
  iVar17 = 0;
  local_108 = 0;
  if (10 < (long)sVar18) {
    uVar11 = sqlite3LogEst((long)sVar18);
    local_108 = uVar11 - 0x21;
  }
  if (pTerm == (WhereTerm *)0x0) {
LAB_001882cc:
    p->prereq = uVar9;
    (p->u).btree.nEq = uVar2;
    (p->u).btree.nBtm = uVar3;
    (p->u).btree.nTop = uVar4;
    p->nSkip = uVar5;
    p->wsFlags = uVar8;
    p->nOut = LVar7;
    p->nLTerm = uVar6;
    if (uVar2 != uVar5) {
      return iVar17;
    }
    if ((uint)pProbe->nKeyCol <= uVar2 + 1) {
      return iVar17;
    }
    if (uVar2 != uVar6) {
      return iVar17;
    }
    if ((*(ushort *)&pProbe->field_0x63 & 0xc0) != 0x80) {
      return iVar17;
    }
    if ((db->dbOptFlags & 0x4000) != 0) {
      return iVar17;
    }
    if (pProbe->aiRowLogEst[(ulong)uVar2 + 1] < 0x2a) {
      return iVar17;
    }
    iVar17 = whereLoopResize(db,p,uVar6 + 1);
    if (iVar17 != 0) {
      return iVar17;
    }
    (p->u).btree.nEq = (p->u).btree.nEq + 1;
    uVar16._0_2_ = p->nLTerm;
    uVar16._2_2_ = p->nSkip;
    p->nLTerm = (undefined2)uVar16 + 1;
    p->nSkip = uVar16._2_2_ + 1;
    p->aLTerm[uVar16 & 0xffff] = (WhereTerm *)0x0;
    pbVar1 = (byte *)((long)&p->wsFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    sVar18 = pProbe->aiRowLogEst[uVar2] - pProbe->aiRowLogEst[(ulong)uVar2 + 1];
    p->nOut = p->nOut - sVar18;
    whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul + sVar18 + 5);
    p->nOut = LVar7;
    (p->u).btree.nEq = uVar2;
    p->nSkip = uVar2;
    p->wsFlags = uVar8;
    return 0;
  }
  local_f8 = (WhereTerm *)0x0;
  local_110 = (WhereTerm *)0x0;
LAB_00187c7b:
  uVar11 = pTerm->eOperator;
  if ((uVar11 == 0x100) || ((pTerm->wtFlags & 0x80) != 0)) {
    sVar20 = pProbe->aiColumn[uVar2];
    if ((long)sVar20 < 0) {
      bVar24 = sVar20 == -1;
    }
    else {
      bVar24 = pProbe->pTable->aCol[sVar20].field_0x8 & 0xf;
    }
    iVar17 = 0;
    if (bVar24 == 0) goto LAB_00187ccd;
    goto LAB_001881a2;
  }
LAB_00187ccd:
  iVar17 = 0;
  if ((((pTerm->prereqRight & p->maskSelf) != 0) ||
      ((uVar11 == 0x10 && ((pTerm->wtFlags & 0x100) != 0)))) ||
     ((((pSrc->fg).jointype & 0x58) != 0 &&
      (((pTerm->pExpr->flags & 3) == 0 || ((pTerm->pExpr->w).iJoin != pSrc->iCursor))))))
  goto LAB_001881a2;
  local_120 = (uint)uVar2;
  if ((pProbe->onError == '\0') || (bVar24 = 2, pProbe->nKeyCol - 1 != local_120)) {
    bVar24 = 1;
  }
  pBuilder->bldFlags1 = pBuilder->bldFlags1 | bVar24;
  p->wsFlags = uVar8;
  (p->u).btree.nEq = uVar2;
  (p->u).btree.nBtm = uVar3;
  (p->u).btree.nTop = uVar4;
  p->nLTerm = uVar6;
  iVar14 = whereLoopResize(db,p,uVar6 + 1);
  iVar17 = 0;
  if (iVar14 != 0) goto LAB_001882cc;
  uVar19 = p->nLTerm;
  uVar13 = uVar19 + 1;
  p->nLTerm = uVar13;
  p->aLTerm[uVar19] = pTerm;
  p->prereq = ~p->maskSelf & (pTerm->prereqRight | uVar9);
  if ((uVar11 & 1) == 0) {
    if ((uVar11 & 0x82) != 0) {
      sVar20 = pProbe->aiColumn[uVar2];
      uVar16 = p->wsFlags;
      uVar23 = uVar16 | 1;
      p->wsFlags = uVar23;
      uVar15 = 0x1001;
      if (sVar20 == -1) {
LAB_00187e27:
        uVar23 = uVar16 | uVar15;
        p->wsFlags = uVar23;
      }
      else if (((nInMul == 0) && (-1 < sVar20)) && (pProbe->nKeyCol - 1 == local_120)) {
        if (((pProbe->field_0x63 & 8) == 0) &&
           (((pProbe->nKeyCol != 1 || (uVar11 != 2)) || (pProbe->onError == '\0')))) {
          uVar15 = 0x10001;
        }
        goto LAB_00187e27;
      }
      uVar16 = 0;
      sVar20 = 0;
      if (1 < local_a0.iEquiv) {
        uVar23 = uVar23 | 0x200000;
        goto LAB_00187f0c;
      }
      goto LAB_00187f11;
    }
    if ((uVar11 >> 8 & 1) != 0) {
      uVar23 = p->wsFlags | 8;
      p->wsFlags = uVar23;
      sVar20 = 0;
      goto LAB_00187f11;
    }
    if ((uVar11 & 0x24) != 0) {
      p->wsFlags = p->wsFlags | 0x22;
      iVar14 = whereRangeVectorLen(pParse,pSrc->iCursor,pProbe,local_120,pTerm);
      (p->u).btree.nBtm = (u16)iVar14;
      local_110 = pTerm;
      if ((pTerm->wtFlags & 0x100) == 0) {
        uVar23 = p->wsFlags;
        sVar20 = 0;
        local_f8 = (WhereTerm *)0x0;
        goto LAB_00187f11;
      }
      iVar14 = whereLoopResize(db,p,p->nLTerm + 1);
      if (iVar14 != 0) goto LAB_001882cc;
      uVar19 = p->nLTerm;
      p->nLTerm = uVar19 + 1;
      p->aLTerm[uVar19] = pTerm + 1;
      uVar23 = p->wsFlags | 0x10;
      p->wsFlags = uVar23;
      (p->u).btree.nTop = 1;
      sVar20 = 0;
      local_f8 = pTerm + 1;
      goto LAB_00187f11;
    }
    p->wsFlags = p->wsFlags | 0x12;
    iVar17 = whereRangeVectorLen(pParse,pSrc->iCursor,pProbe,(uint)uVar2,pTerm);
    (p->u).btree.nTop = (u16)iVar17;
    uVar23 = p->wsFlags;
    local_f8 = pTerm;
    if ((uVar23 & 0x20) != 0) {
      local_110 = p->aLTerm[(ulong)p->nLTerm - 2];
      sVar20 = 0;
      goto LAB_00187f11;
    }
    if ((uVar23 & 2) != 0) {
      uVar11 = p->nOut;
      local_110 = (WhereTerm *)0x0;
      sVar20 = 0;
      uVar19 = uVar11;
      goto LAB_00188053;
    }
    local_110 = (WhereTerm *)0x0;
    sVar20 = 0;
LAB_00187f17:
    uVar16 = (p->u).vtab.idxNum + 1;
    (p->u).btree.nEq = (u16)uVar16;
    if ((pTerm->truthProb < 1) && (-1 < pProbe->aiColumn[uVar2])) {
      uVar16 = (uint)(ushort)((pTerm->truthProb - sVar20) + p->nOut);
    }
    else {
      uVar21 = (ulong)(uVar16 & 0xffff);
      uVar19 = (pProbe->aiRowLogEst[uVar21] - pProbe->aiRowLogEst[uVar21 - 1]) + p->nOut;
      uVar16 = uVar19 + 10;
      if ((uVar11 >> 8 & 1) == 0) {
        uVar16 = (uint)uVar19;
      }
    }
  }
  else {
    pEVar10 = pTerm->pExpr;
    if ((pEVar10->flags & 0x1000) == 0) {
      uVar16 = 0;
      if (((pEVar10->x).pList != (ExprList *)0x0) &&
         (x = (u64)((pEVar10->x).pList)->nExpr, uVar16 = 0, x != 0)) {
        LVar12 = sqlite3LogEst(x);
        uVar16 = (uint)LVar12;
      }
    }
    else {
      uVar16 = 0x2e;
      if (1 < uVar13) {
        uVar15 = 0x2e;
        uVar16 = 0x2e;
        uVar21 = 0;
        do {
          if ((p->aLTerm[uVar21] != (WhereTerm *)0x0) &&
             (uVar16 = uVar15, p->aLTerm[uVar21]->pExpr == pEVar10)) {
            uVar15 = 0;
            uVar16 = 0;
          }
          uVar21 = uVar21 + 1;
        } while (uVar13 - 1 != uVar21);
      }
    }
    if (((pProbe->field_0x63 & 0x80) != 0) && (9 < (short)local_108)) {
      uVar19 = pProbe->aiRowLogEst[uVar2];
      uVar15 = 0;
      if (10 < (int)uVar16) {
        uVar13 = sqlite3LogEst((ulong)(uVar16 & 0xffff));
        uVar15 = uVar13 - 0x21 & 0xffff;
      }
      if ((short)((short)(((uint)uVar19 - ((local_108 & 0xffff) + uVar16)) + uVar15) + 10) < 0) {
        iVar17 = 0;
        if ((1 < nInMul) || ((db->dbOptFlags & 0x20000) != 0)) goto LAB_001881a2;
        pbVar1 = (byte *)((long)&p->wsFlags + 2);
        *pbVar1 = *pbVar1 | 0x10;
      }
    }
    uVar23 = p->wsFlags | 4;
LAB_00187f0c:
    sVar20 = (short)uVar16;
    p->wsFlags = uVar23;
LAB_00187f11:
    if ((uVar23 & 2) == 0) goto LAB_00187f17;
    uVar11 = p->nOut;
    uVar19 = uVar11;
    if (local_110 != (WhereTerm *)0x0) {
      if (local_110->truthProb < 1) {
        uVar19 = local_110->truthProb + uVar11;
      }
      else {
        uVar19 = uVar11 - 0x14;
        if ((local_110->wtFlags & 0x80) != 0) {
          uVar19 = uVar11;
        }
      }
    }
    pTerm = local_f8;
    if (local_f8 == (WhereTerm *)0x0) {
      pTerm = (WhereTerm *)0x0;
      uVar13 = uVar19;
    }
    else {
LAB_00188053:
      if (pTerm->truthProb < 1) {
        uVar13 = pTerm->truthProb + uVar19;
      }
      else {
        uVar13 = uVar19 - 0x14;
        if ((pTerm->wtFlags & 0x80) != 0) {
          uVar13 = uVar19;
        }
      }
    }
    uVar19 = uVar13;
    if (((local_110 != (WhereTerm *)0x0) && (pTerm != (WhereTerm *)0x0)) &&
       ((0 < local_110->truthProb && (uVar19 = uVar13 - 0x14, pTerm->truthProb < 1)))) {
      uVar19 = uVar13;
    }
    uVar16 = (-1 - (uint)(pTerm != (WhereTerm *)0x0)) + (uint)(local_110 == (WhereTerm *)0x0) +
             (int)(short)uVar11;
    uVar11 = 10;
    if (10 < (short)uVar19) {
      uVar11 = uVar19;
    }
    local_f8 = pTerm;
    if ((int)(uint)uVar11 <= (int)uVar16) {
      uVar16 = (uint)uVar11;
    }
  }
  sVar22 = (short)uVar16;
  a = sqlite3LogEstAdd((short)local_108,
                       (short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow) + sVar22 + 1);
  if ((uVar23 & 0x140) == 0) {
    a = sqlite3LogEstAdd(a,sVar22 + 0x10);
  }
  sVar20 = sVar20 + nInMul;
  p->rRun = a + sVar20;
  p->nOut = sVar22 + sVar20;
  whereLoopOutputAdjust(pBuilder->pWC,p,sVar18);
  iVar17 = whereLoopInsert(pBuilder,p);
  if ((p->wsFlags & 2) != 0) {
    sVar22 = LVar7;
  }
  p->nOut = sVar22;
  if ((((p->wsFlags & 0x10) == 0) && (uVar11 = (p->u).btree.nEq, uVar11 < pProbe->nColumn)) &&
     ((uVar11 < pProbe->nKeyCol || ((*(ushort *)&pProbe->field_0x63 & 3) != 2)))) {
    whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,sVar20);
  }
  p->nOut = LVar7;
LAB_001881a2:
  pTerm = whereScanNext(&local_a0);
  if ((iVar17 != 0) || (pTerm == (WhereTerm *)0x0)) goto LAB_001882cc;
  goto LAB_00187c7b;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  SrcItem *pSrc,                  /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d, nSkip=%d, rRun=%d\n",
                     pProbe->pTable->zName,pProbe->zName,
                     pNew->u.btree.nEq, pNew->nSkip, pNew->rRun));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );
  assert( pNew->u.btree.nEq<pProbe->nKeyCol
       || pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* tag-20191211-001:  Do not allow constraints from the WHERE clause to
    ** be used by the right table of a LEFT JOIN nor by the left table of a
    ** RIGHT JOIN.  Only constraints in the ON clause are allowed.
    ** See tag-20191211-002 for the vtab equivalent.
    **
    ** 2022-06-06: See https://sqlite.org/forum/forumpost/206d99a16dd9212f
    ** for an example of a WHERE clause constraints that may not be used on
    ** the right table of a RIGHT JOIN because the constraint implies a
    ** not-NULL condition on the left table of the RIGHT JOIN.
    **
    ** 2022-06-10: The same condition applies to termCanDriveIndex() above.
    ** https://sqlite.org/forum/forumpost/51e6959f61
    */
    if( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0 ){
      testcase( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))==JT_LEFT );
      testcase( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))==JT_RIGHT );
      testcase( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))==JT_LTORJ );
      testcase( ExprHasProperty(pTerm->pExpr, EP_OuterON) )
      testcase( ExprHasProperty(pTerm->pExpr, EP_InnerON) );
      if( !ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON)
       || pTerm->pExpr->w.iJoin != pSrc->iCursor
      ){
        continue;
      }
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags1 |= SQLITE_BLDF1_UNIQUE;
    }else{
      pBuilder->bldFlags1 |= SQLITE_BLDF1_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprUseXSelect(pExpr) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
      }
      if( pProbe->hasStat1 && rLogSize>=10 ){
        LogEst M, logK, x;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.  Do not bother with this optimization on very small
        ** tables (less than 2 rows) as it is pointless in that case.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        /* TUNING      v-----  10 to bias toward indexed IN */
        x = M + logK + 10 - (nIn + rLogSize);
        if( x>=0 ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d) "
             "prefers indexed lookup\n",
             saved_nEq, M, logK, nIn, rLogSize, x));
        }else if( nInMul<2 && OptimizationEnabled(db, SQLITE_SeekScan) ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers skip-scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          pNew->wsFlags |= WHERE_IN_SEEKSCAN;
        }else{
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers normal scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          continue;
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ)
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
      if( scan.iEquiv>1 ) pNew->wsFlags |= WHERE_TRANSCONS;
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range constraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat4 data. Or, if there is no stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0
         && pProbe->nSample
         && ALWAYS(pNew->u.btree.nEq<=pProbe->nSampleCol)
         && ((eOp & WO_IN)==0 || ExprUseXList(pTerm->pExpr))
         && OptimizationEnabled(db, SQLITE_Stat4)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( nEq==1
             /* TUNING: Mark terms as "low selectivity" if they seem likely
             ** to be true for half or more of the rows in the table.
             ** See tag-202002240-1 */
             && pNew->nOut+10 > pProbe->aiRowLogEst[0]
            ){
#if WHERETRACE_ENABLED /* 0x01 */
              if( sqlite3WhereTrace & 0x01 ){
                sqlite3DebugPrintf(
                   "STAT4 determines term has low selectivity:\n");
                sqlite3WhereTermPrint(pTerm, 999);
              }
#endif
              pTerm->wtFlags |= TERM_HIGHTRUTH;
              if( pTerm->wtFlags & TERM_HEURTRUTH ){
                /* If the term has previously been used with an assumption of
                ** higher selectivity, then set the flag to rerun the
                ** loop computations. */
                pBuilder->bldFlags2 |= SQLITE_BLDF2_2NDPASS;
              }
            }
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a
            ** "col IS NULL" expression matches twice as many rows
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    assert( pSrc->pTab->szTabRow>0 );
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
     && (pNew->u.btree.nEq<pProbe->nKeyCol ||
           pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY)
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18.
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower.
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && saved_nEq==pNew->nLTerm
   && pProbe->noSkipScan==0
   && pProbe->hasStat1!=0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}